

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_low_impl.h
# Opt level: O2

void secp256k1_scalar_cmov(secp256k1_scalar *r,secp256k1_scalar *a,int flag)

{
  ulong uVar1;
  ulong uVar2;
  uint *puVar3;
  int vflag;
  unsigned_long _zzq_result;
  unsigned_long _zzq_args [6];
  
  uVar1 = (ulong)((long)r << 3) >> 0x33;
  uVar2 = (((long)r << 3 | (ulong)r >> 0x3d) << 0xd | uVar1) >> 3;
  puVar3 = (uint *)(uVar2 << 0x33 | (uVar1 << 0x3d | uVar2) >> 0xd);
  *puVar3 = -flag & *a | flag - 1U & *puVar3;
  return;
}

Assistant:

static SECP256K1_INLINE void secp256k1_scalar_cmov(secp256k1_scalar *r, const secp256k1_scalar *a, int flag) {
    uint32_t mask0, mask1;
    volatile int vflag = flag;
    SECP256K1_CHECKMEM_CHECK_VERIFY(r, sizeof(*r));
    mask0 = vflag + ~((uint32_t)0);
    mask1 = ~mask0;
    *r = (*r & mask0) | (*a & mask1);
}